

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_6.cpp
# Opt level: O3

int main(void)

{
  undefined8 in_RAX;
  ulong uVar1;
  long *plVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  int *piVar7;
  int n;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_38 + 4));
  if (0 < uStack_38._4_4_) {
    lVar5 = 0;
    piVar7 = num;
    do {
      std::istream::operator>>((istream *)&std::cin,piVar7);
      lVar5 = lVar5 + 1;
      piVar7 = piVar7 + 1;
    } while (lVar5 < uStack_38._4_4_);
  }
  uVar6 = 0;
  if (uStack_38._4_4_ == 0) {
    uStack_38._4_4_ = 0;
  }
  else {
    uVar1 = (ulong)uStack_38._4_4_;
    lVar5 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (num,num + uVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(num,num + uVar1);
    uVar6 = 0;
    if (0 < (long)uStack_38._4_4_) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        if ((lVar5 != 0) && (num[lVar5] != (&DAT_0010408c)[lVar5])) {
          lVar4 = (long)(int)uVar6;
          uVar6 = uVar6 + 1;
          ans[lVar4] = (&DAT_0010408c)[lVar5];
        }
        lVar5 = lVar5 + 1;
      } while (uStack_38._4_4_ != lVar5);
    }
  }
  ans[(int)uVar6] = (&DAT_0010408c)[uStack_38._4_4_];
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar6 + 1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (-1 < (int)uVar6) {
    lVar5 = 0;
    do {
      if ((ulong)uVar6 * 4 - lVar5 == 0) {
        std::ostream::operator<<((ostream *)&std::cout,ans[uVar6]);
      }
      else {
        poVar3 = (ostream *)
                 std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)ans + lVar5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      }
      lVar5 = lVar5 + 4;
    } while ((ulong)(uVar6 + 1) << 2 != lVar5);
  }
  return 0;
}

Assistant:

int main()
{
    int n,m;
    cin >> n;
    for (int i = 0; i < n; ++i) {
        cin  >> num[i];
    }
    sort(num,num + n);
    m = 0;
    for (int j = 0; j < n; ++j) {
        if(j != 0 && num[j] != num[j-1] )
        ans[m++] = num[j-1];
    }
    ans[m++]  = num[n-1];
    cout << m <<endl;
    for (int k = 0; k < m; ++k) {
        if(k != m-1)
            cout << ans[k] << " ";
        else
            cout << ans[k];
    }
    return 0;
}